

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall
PeleLM::zeroBoundaryVisc
          (PeleLM *this,MultiFab **beta,Real param_2,int state_comp,int dst_comp,int ncomp)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int dir;
  long lVar5;
  Box bx_1;
  Box edom;
  MFIter mfi;
  int local_10c [5];
  undefined8 uStack_f8;
  undefined4 uStack_f0;
  int local_ec [2];
  undefined8 uStack_e4;
  MFIter local_d0;
  Array4<double> local_70;
  
  lVar5 = 0;
  do {
    uStack_f8 = *(undefined8 *)
                 (this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect;
    uVar2 = *(undefined8 *)
             ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect + 2);
    uStack_e4 = *(undefined8 *)
                 ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect + 2);
    local_ec[1] = (int)((ulong)*(undefined8 *)
                                (this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.
                                vect >> 0x20);
    uVar3 = uStack_e4;
    uStack_f0 = (undefined4)uVar2;
    local_ec[0] = (int)((ulong)uVar2 >> 0x20);
    uStack_e4._4_4_ = (uint)((ulong)uStack_e4 >> 0x20);
    uVar4 = 1 << ((byte)lVar5 & 0x1f);
    uVar1 = uStack_e4._4_4_ >> ((uint)lVar5 & 0x1f);
    uStack_e4 = uVar3;
    if ((uVar1 & 1) == 0) {
      local_ec[lVar5] = local_ec[lVar5] + 1;
      uStack_e4 = CONCAT44(uStack_e4._4_4_ | uVar4,(undefined4)uStack_e4);
    }
    amrex::MFIter::MFIter(&local_d0,(FabArrayBase *)beta[lVar5],true);
    if (local_d0.currentIndex < local_d0.endIndex) {
      do {
        amrex::MFIter::growntilebox((Box *)&local_70,&local_d0,-1000000);
        local_10c._8_8_ = local_70._20_8_;
        uVar2 = local_10c._8_8_;
        local_10c[3] = (int)local_70.nstride;
        uVar1 = local_10c[3] & 1 << ((byte)lVar5 & 0x1f);
        local_10c._8_8_ = uVar2;
        if (uVar1 == 0) {
          local_10c[lVar5] = local_10c[lVar5] + 1;
          local_10c[3] = local_10c[3] | uVar4;
        }
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_70,&beta[lVar5]->super_FabArray<amrex::FArrayBox>,&local_d0,dst_comp);
        amrex::MFIter::operator++(&local_d0);
      } while (local_d0.currentIndex < local_d0.endIndex);
    }
    amrex::MFIter::~MFIter(&local_d0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

void
PeleLM::zeroBoundaryVisc (MultiFab*  beta[AMREX_SPACEDIM],
                          const Real /*time*/,
                          const int  state_comp,
                          const int  dst_comp,
                          const int  ncomp) const
{
  AMREX_ASSERT(state_comp > Density);

  const auto geomdata = geom.data();

  for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
  {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
      const Box edom = amrex::surroundingNodes(geom.Domain(),dir);
      for (MFIter mfi(*(beta[dir]),TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
        const Box& ebox     = amrex::surroundingNodes(mfi.growntilebox(),dir);
        auto const& beta_arr = beta[dir]->array(mfi,dst_comp);
        amrex::ParallelFor(ebox, [beta_arr,dir,geomdata,edom,state_comp,ncomp]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
          zero_visc(i, j, k, beta_arr, geomdata, edom, dir, state_comp, ncomp);
        });
      }
    }
  }
}